

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getStringByKey_63(UResourceBundle *resB,char *inKey,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  ResourceData *pResData;
  UChar *pUVar2;
  UResourceBundle *pUVar3;
  UResourceBundle *tempRes_1;
  UChar *result_1;
  UResourceBundle *tempRes;
  UChar *result;
  ResourceData *rd;
  int32_t t;
  int32_t type;
  char *key;
  UResourceDataEntry *realData;
  UErrorCode *pUStack_30;
  Resource res;
  UErrorCode *status_local;
  int32_t *len_local;
  char *inKey_local;
  UResourceBundle *resB_local;
  
  realData._4_4_ = 0xffffffff;
  key = (char *)0x0;
  if ((status == (UErrorCode *)0x0) ||
     (_t = (int32_t *)inKey, pUStack_30 = status, status_local = len, len_local = (int32_t *)inKey,
     inKey_local = (char *)resB, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return (UChar *)0x0;
  }
  if (inKey_local == (char *)0x0) {
    *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  rd._4_4_ = *(uint *)(inKey_local + 0xac) >> 0x1c;
  if (((rd._4_4_ == 2) || (rd._4_4_ == 5)) || (rd._4_4_ == 4)) {
    rd._0_4_ = 0;
    realData._4_4_ =
         res_getTableItemByKey_63
                   ((ResourceData *)(inKey_local + 0x28),*(Resource *)(inKey_local + 0xac),
                    (int32_t *)&rd,(char **)&t);
    if (realData._4_4_ != 0xffffffff) {
      if (realData._4_4_ >> 0x1c != 0) {
        if (realData._4_4_ >> 0x1c == 3) {
          pUVar3 = ures_getByKey_63((UResourceBundle *)inKey_local,(char *)len_local,
                                    (UResourceBundle *)0x0,pUStack_30);
          pUVar2 = ures_getString_63(pUVar3,status_local,pUStack_30);
          ures_close_63(pUVar3);
          return pUVar2;
        }
        if (realData._4_4_ >> 0x1c != 6) {
          *pUStack_30 = U_RESOURCE_TYPE_MISMATCH;
          return (UChar *)0x0;
        }
      }
      pUVar2 = res_getString_63((ResourceData *)(inKey_local + 0x28),realData._4_4_,status_local);
      return pUVar2;
    }
    _t = len_local;
    if (inKey_local[0xb0] == '\x01') {
      pResData = getFallbackData((UResourceBundle *)inKey_local,(char **)&t,
                                 (UResourceDataEntry **)&key,(Resource *)((long)&realData + 4),
                                 pUStack_30);
      UVar1 = U_SUCCESS(*pUStack_30);
      if (UVar1 != '\0') {
        if (realData._4_4_ >> 0x1c != 0) {
          if (realData._4_4_ >> 0x1c == 3) {
            pUVar3 = ures_getByKey_63((UResourceBundle *)inKey_local,(char *)len_local,
                                      (UResourceBundle *)0x0,pUStack_30);
            pUVar2 = ures_getString_63(pUVar3,status_local,pUStack_30);
            ures_close_63(pUVar3);
            return pUVar2;
          }
          if (realData._4_4_ >> 0x1c != 6) {
            *pUStack_30 = U_RESOURCE_TYPE_MISMATCH;
            return (UChar *)0x0;
          }
        }
        pUVar2 = res_getString_63(pResData,realData._4_4_,status_local);
        return pUVar2;
      }
      *pUStack_30 = U_MISSING_RESOURCE_ERROR;
    }
    else {
      *pUStack_30 = U_MISSING_RESOURCE_ERROR;
    }
  }
  else {
    *pUStack_30 = U_RESOURCE_TYPE_MISMATCH;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getStringByKey(const UResourceBundle *resB, const char* inKey, int32_t* len, UErrorCode *status) {
    Resource res = RES_BOGUS;
    UResourceDataEntry *realData = NULL;
    const char* key = inKey;

    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        int32_t t=0;

        res = res_getTableItemByKey(&(resB->fResData), resB->fRes, &t, &key);

        if(res == RES_BOGUS) {
            key = inKey;
            if(resB->fHasFallback == TRUE) {
                const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
                if(U_SUCCESS(*status)) {
                    switch (RES_GET_TYPE(res)) {
                    case URES_STRING:
                    case URES_STRING_V2:
                        return res_getString(rd, res, len);
                    case URES_ALIAS:
                      {
                        const UChar* result = 0;
                        UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                        result = ures_getString(tempRes, len, status);
                        ures_close(tempRes);
                        return result;
                      }
                    default:
                        *status = U_RESOURCE_TYPE_MISMATCH;
                    }
                } else {
                    *status = U_MISSING_RESOURCE_ERROR;
                }
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            switch (RES_GET_TYPE(res)) {
            case URES_STRING:
            case URES_STRING_V2:
                return res_getString(&(resB->fResData), res, len);
            case URES_ALIAS:
              {
                const UChar* result = 0;
                UResourceBundle *tempRes = ures_getByKey(resB, inKey, NULL, status);
                result = ures_getString(tempRes, len, status);
                ures_close(tempRes);
                return result;
              }
            default:
                *status = U_RESOURCE_TYPE_MISMATCH;
            }
        }
    } 
#if 0 
    /* this is a kind of TODO item. If we have an array with an index table, we could do this. */
    /* not currently */   
    else if(RES_GET_TYPE(resB->fRes) == URES_ARRAY && resB->fHasFallback == TRUE) {
        /* here should go a first attempt to locate the key using index table */
        const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);
        if(U_SUCCESS(*status)) {
            return res_getString(rd, res, len);
        } else {
            *status = U_MISSING_RESOURCE_ERROR;
        }
    } 
#endif    
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }